

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNReplaced::gen_code(CTPNReplaced *this,int discard,int for_condition)

{
  CTcSymFunc *pCVar1;
  CTPNCodeBodyBase *in_RDI;
  CTcSymFunc *mod_base;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  
  CTcCodeStream::get_code_body(G_cs);
  pCVar1 = CTPNCodeBodyBase::get_replaced_func(in_RDI);
  if (pCVar1 == (CTcSymFunc *)0x0) {
    CTcTokenizer::log_error(0x2d22);
  }
  CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
  if (pCVar1 != (CTcSymFunc *)0x0) {
    CTcSymFuncBase::add_abs_fixup(&mod_base->super_CTcSymFuncBase,(CTcDataStream *)in_RDI);
  }
  CTcDataStream::write4((CTcDataStream *)mod_base,(ulong)in_RDI);
  CTcGenTarg::note_push((CTcGenTarg *)0x2cfcaf);
  return;
}

Assistant:

void CTPNReplaced::gen_code(int discard, int for_condition)
{
    /* get the modified base function symbol */
    CTcSymFunc *mod_base = G_cs->get_code_body()->get_replaced_func();

    /* make sure we're in a 'modify func()' context */
    if (mod_base == 0)
        G_tok->log_error(TCERR_REPLACED_NOT_AVAIL);

    /* this expression yields a pointer to the modified base function */
    G_cg->write_op(OPC_PUSHFNPTR);

    /* add a fixup for the current code location */
    if (mod_base != 0)
        mod_base->add_abs_fixup(G_cs);

    /* write a placeholder offset - arbitrarily use zero */
    G_cs->write4(0);

    /* note the push */
    G_cg->note_push();
}